

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateUniDirectionalLSTMLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  void *pvVar3;
  NeuralNetworkLayer *pNVar4;
  bool bVar5;
  undefined1 *puVar6;
  long *plVar7;
  uint32_t uVar8;
  size_type *psVar9;
  undefined1 *puVar10;
  Result *_result;
  long lVar11;
  uint64_t uVar12;
  long lVar13;
  InternalMetadata *pIVar14;
  string err;
  UniDirectionalLSTMLayerParams recurrent;
  string local_110;
  string local_f0;
  uint64_t local_d0;
  NeuralNetworkLayer *local_c8;
  undefined1 local_c0 [40];
  LSTMParams *local_98;
  LSTMWeightParams *local_90;
  uint64_t local_88;
  uint64_t local_80;
  string local_70;
  LSTMParams local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,3);
  bVar5 = Result::good(__return_storage_ptr__);
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  validateOutputCount(__return_storage_ptr__,layer,3,3);
  bVar5 = Result::good(__return_storage_ptr__);
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (this->ndArrayInterpretation == true) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"UniDirectionalLSTM","");
    validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_70,&this->blobNameToRank);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar5 = Result::good(__return_storage_ptr__);
    if (!bVar5) {
      return __return_storage_ptr__;
    }
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    local_c0._0_8_ = local_c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"UniDirectionalLSTM","");
    validateRankCount(__return_storage_ptr__,layer,(string *)local_c0,5,5,&this->blobNameToRank);
    if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    bVar5 = Result::good(__return_storage_ptr__);
    if (!bVar5) {
      return __return_storage_ptr__;
    }
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
  }
  uVar8 = layer->_oneof_case_[0];
  puVar6 = *(undefined1 **)&layer->layer_;
  puVar10 = puVar6;
  if (uVar8 != 0x1a4) {
    puVar10 = Specification::_UniDirectionalLSTMLayerParams_default_instance_;
  }
  pIVar14 = &(((BatchnormLayerParams *)puVar10)->mean_->super_MessageLite)._internal_metadata_;
  if (((BatchnormLayerParams *)puVar10)->mean_ == (WeightParams *)0x0) {
    pIVar14 = (InternalMetadata *)0x0;
  }
  lVar11 = (long)*(int *)&(((ConvolutionLayerParams *)puVar10)->kernelsize_).arena_or_elements_;
  if (lVar11 != 0) {
    lVar13 = 0;
    do {
      validateRecurrentActivationParams
                (__return_storage_ptr__,*(ActivationParams **)((long)&pIVar14->ptr_ + lVar13));
      bVar5 = Result::good(__return_storage_ptr__);
      if (!bVar5) {
        return __return_storage_ptr__;
      }
      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
      lVar13 = lVar13 + 8;
    } while (lVar11 * 8 != lVar13);
    uVar8 = layer->_oneof_case_[0];
    puVar6 = *(undefined1 **)&layer->layer_;
  }
  if (uVar8 != 0x1a4) {
    puVar6 = Specification::_UniDirectionalLSTMLayerParams_default_instance_;
  }
  puVar10 = (undefined1 *)((UniDirectionalLSTMLayerParams *)puVar6)->params_;
  puVar6 = (undefined1 *)((UniDirectionalLSTMLayerParams *)puVar6)->weightparams_;
  if ((LSTMWeightParams *)puVar6 == (LSTMWeightParams *)0x0) {
    puVar6 = Specification::_LSTMWeightParams_default_instance_;
  }
  if ((LSTMParams *)puVar10 == (LSTMParams *)0x0) {
    puVar10 = Specification::_LSTMParams_default_instance_;
  }
  Specification::LSTMParams::LSTMParams(&local_50,(LSTMParams *)puVar10);
  validateLSTMWeightParams(__return_storage_ptr__,(LSTMWeightParams *)puVar6,&local_50);
  Specification::LSTMParams::~LSTMParams(&local_50);
  bVar5 = Result::good(__return_storage_ptr__);
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (layer->_oneof_case_[0] == 0x1a4) {
    puVar6 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar6 = Specification::_UniDirectionalLSTMLayerParams_default_instance_;
  }
  Specification::UniDirectionalLSTMLayerParams::UniDirectionalLSTMLayerParams
            ((UniDirectionalLSTMLayerParams *)local_c0,(UniDirectionalLSTMLayerParams *)puVar6);
  if (local_c0._24_4_ == 3) {
    puVar6 = (undefined1 *)local_90;
    if (local_90 == (LSTMWeightParams *)0x0) {
      puVar6 = Specification::_LSTMWeightParams_default_instance_;
    }
    local_d0 = local_80;
    puVar6 = (undefined1 *)((LSTMWeightParams *)puVar6)->inputgateweightmatrix_;
    if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
      puVar6 = Specification::_WeightParams_default_instance_;
    }
    uVar12 = local_88 * local_80;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Unidirectional LSTM","");
    pvVar3 = (layer->name_).tagged_ptr_.ptr_;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    local_c8 = layer;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"input gate weight matrix","");
    validateGeneralWeightParams
              (__return_storage_ptr__,(WeightParams *)puVar6,uVar12,local_d0,&local_110,
               (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_f0);
    pNVar4 = local_c8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    bVar5 = Result::good(__return_storage_ptr__);
    if (bVar5) {
      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
      puVar6 = (undefined1 *)local_90;
      if (local_90 == (LSTMWeightParams *)0x0) {
        puVar6 = Specification::_LSTMWeightParams_default_instance_;
      }
      puVar6 = (undefined1 *)((LSTMWeightParams *)puVar6)->forgetgateweightmatrix_;
      if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
        puVar6 = Specification::_WeightParams_default_instance_;
      }
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Unidirectional LSTM","")
      ;
      pvVar3 = (pNVar4->name_).tagged_ptr_.ptr_;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"forget gate weight matrix","");
      validateGeneralWeightParams
                (__return_storage_ptr__,(WeightParams *)puVar6,uVar12,local_d0,&local_110,
                 (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_f0);
      pNVar4 = local_c8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      bVar5 = Result::good(__return_storage_ptr__);
      if (bVar5) {
        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
        puVar6 = (undefined1 *)local_90;
        if (local_90 == (LSTMWeightParams *)0x0) {
          puVar6 = Specification::_LSTMWeightParams_default_instance_;
        }
        puVar6 = (undefined1 *)((LSTMWeightParams *)puVar6)->blockinputweightmatrix_;
        if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
          puVar6 = Specification::_WeightParams_default_instance_;
        }
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,"Unidirectional LSTM","");
        pvVar3 = (pNVar4->name_).tagged_ptr_.ptr_;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"block input gate weight matrix","");
        validateGeneralWeightParams
                  (__return_storage_ptr__,(WeightParams *)puVar6,uVar12,local_d0,&local_110,
                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_f0);
        pNVar4 = local_c8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        bVar5 = Result::good(__return_storage_ptr__);
        if (bVar5) {
          pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar2 != paVar1) {
            operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
          }
          puVar6 = (undefined1 *)local_90;
          if (local_90 == (LSTMWeightParams *)0x0) {
            puVar6 = Specification::_LSTMWeightParams_default_instance_;
          }
          puVar6 = (undefined1 *)((LSTMWeightParams *)puVar6)->outputgateweightmatrix_;
          if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
            puVar6 = Specification::_WeightParams_default_instance_;
          }
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_110,"Unidirectional LSTM","");
          pvVar3 = (pNVar4->name_).tagged_ptr_.ptr_;
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,"output gate weight matrix","");
          validateGeneralWeightParams
                    (__return_storage_ptr__,(WeightParams *)puVar6,uVar12,local_d0,&local_110,
                     (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_f0);
          pNVar4 = local_c8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          bVar5 = Result::good(__return_storage_ptr__);
          if (bVar5) {
            pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 != paVar1) {
              operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
            }
            puVar6 = (undefined1 *)local_90;
            if (local_90 == (LSTMWeightParams *)0x0) {
              puVar6 = Specification::_LSTMWeightParams_default_instance_;
            }
            puVar6 = (undefined1 *)((LSTMWeightParams *)puVar6)->inputgaterecursionmatrix_;
            if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
              puVar6 = Specification::_WeightParams_default_instance_;
            }
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_110,"Unidirectional LSTM","");
            pvVar3 = (pNVar4->name_).tagged_ptr_.ptr_;
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"input gate recursion matrix","");
            uVar12 = local_d0 * local_d0;
            validateGeneralWeightParams
                      (__return_storage_ptr__,(WeightParams *)puVar6,uVar12,local_d0,&local_110,
                       (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_f0);
            pNVar4 = local_c8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            bVar5 = Result::good(__return_storage_ptr__);
            if (bVar5) {
              pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar2 != paVar1) {
                operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
              }
              puVar6 = (undefined1 *)local_90;
              if (local_90 == (LSTMWeightParams *)0x0) {
                puVar6 = Specification::_LSTMWeightParams_default_instance_;
              }
              puVar6 = (undefined1 *)((LSTMWeightParams *)puVar6)->forgetgaterecursionmatrix_;
              if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
                puVar6 = Specification::_WeightParams_default_instance_;
              }
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_110,"Unidirectional LSTM","");
              pvVar3 = (pNVar4->name_).tagged_ptr_.ptr_;
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_f0,"forget gate recursion matrix","");
              validateGeneralWeightParams
                        (__return_storage_ptr__,(WeightParams *)puVar6,uVar12,local_d0,&local_110,
                         (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_f0);
              pNVar4 = local_c8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
                operator_delete(local_110._M_dataplus._M_p,
                                local_110.field_2._M_allocated_capacity + 1);
              }
              bVar5 = Result::good(__return_storage_ptr__);
              if (bVar5) {
                pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar2 != paVar1) {
                  operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                }
                puVar6 = (undefined1 *)local_90;
                if (local_90 == (LSTMWeightParams *)0x0) {
                  puVar6 = Specification::_LSTMWeightParams_default_instance_;
                }
                puVar6 = (undefined1 *)((LSTMWeightParams *)puVar6)->blockinputrecursionmatrix_;
                if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
                  puVar6 = Specification::_WeightParams_default_instance_;
                }
                local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_110,"Unidirectional LSTM","");
                pvVar3 = (pNVar4->name_).tagged_ptr_.ptr_;
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_f0,"block input gate recursion matrix","");
                validateGeneralWeightParams
                          (__return_storage_ptr__,(WeightParams *)puVar6,uVar12,local_d0,&local_110,
                           (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_f0);
                pNVar4 = local_c8;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._M_dataplus._M_p != &local_110.field_2) {
                  operator_delete(local_110._M_dataplus._M_p,
                                  local_110.field_2._M_allocated_capacity + 1);
                }
                bVar5 = Result::good(__return_storage_ptr__);
                if (bVar5) {
                  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar2 != paVar1) {
                    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                  }
                  puVar6 = (undefined1 *)local_90;
                  if (local_90 == (LSTMWeightParams *)0x0) {
                    puVar6 = Specification::_LSTMWeightParams_default_instance_;
                  }
                  puVar6 = (undefined1 *)((LSTMWeightParams *)puVar6)->outputgaterecursionmatrix_;
                  if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
                    puVar6 = Specification::_WeightParams_default_instance_;
                  }
                  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_110,"Unidirectional LSTM","");
                  pvVar3 = (pNVar4->name_).tagged_ptr_.ptr_;
                  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_f0,"output gate recursion matrix","");
                  validateGeneralWeightParams
                            (__return_storage_ptr__,(WeightParams *)puVar6,uVar12,local_d0,
                             &local_110,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_f0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                    operator_delete(local_f0._M_dataplus._M_p,
                                    local_f0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_110._M_dataplus._M_p != &local_110.field_2) {
                    operator_delete(local_110._M_dataplus._M_p,
                                    local_110.field_2._M_allocated_capacity + 1);
                  }
                  bVar5 = Result::good(__return_storage_ptr__);
                  if (bVar5) {
                    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)pcVar2 != paVar1) {
                      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                    }
                    puVar6 = (undefined1 *)local_98;
                    if (local_98 == (LSTMParams *)0x0) {
                      puVar6 = Specification::_LSTMParams_default_instance_;
                    }
                    if (((LSTMParams *)puVar6)->hasbiasvectors_ == true) {
                      puVar6 = (undefined1 *)local_90;
                      if (local_90 == (LSTMWeightParams *)0x0) {
                        puVar6 = Specification::_LSTMWeightParams_default_instance_;
                      }
                      puVar6 = (undefined1 *)((LSTMWeightParams *)puVar6)->inputgatebiasvector_;
                      if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
                        puVar6 = Specification::_WeightParams_default_instance_;
                      }
                      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_110,"Unidirectional LSTM","");
                      pvVar3 = (local_c8->name_).tagged_ptr_.ptr_;
                      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_f0,"input gate bias vector","");
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar6,local_d0,1,&local_110
                                 ,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_f0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                        operator_delete(local_f0._M_dataplus._M_p,
                                        local_f0.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_110._M_dataplus._M_p != &local_110.field_2) {
                        operator_delete(local_110._M_dataplus._M_p,
                                        local_110.field_2._M_allocated_capacity + 1);
                      }
                      bVar5 = Result::good(__return_storage_ptr__);
                      if (!bVar5) goto LAB_00342905;
                      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)pcVar2 != paVar1) {
                        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                      }
                      puVar6 = (undefined1 *)local_90;
                      if (local_90 == (LSTMWeightParams *)0x0) {
                        puVar6 = Specification::_LSTMWeightParams_default_instance_;
                      }
                      puVar6 = (undefined1 *)((LSTMWeightParams *)puVar6)->forgetgatebiasvector_;
                      if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
                        puVar6 = Specification::_WeightParams_default_instance_;
                      }
                      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_110,"Unidirectional LSTM","");
                      pvVar3 = (local_c8->name_).tagged_ptr_.ptr_;
                      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_f0,"forget gate bias vector","");
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar6,local_d0,1,&local_110
                                 ,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_f0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                        operator_delete(local_f0._M_dataplus._M_p,
                                        local_f0.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_110._M_dataplus._M_p != &local_110.field_2) {
                        operator_delete(local_110._M_dataplus._M_p,
                                        local_110.field_2._M_allocated_capacity + 1);
                      }
                      bVar5 = Result::good(__return_storage_ptr__);
                      if (!bVar5) goto LAB_00342905;
                      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)pcVar2 != paVar1) {
                        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                      }
                      puVar6 = (undefined1 *)local_90;
                      if (local_90 == (LSTMWeightParams *)0x0) {
                        puVar6 = Specification::_LSTMWeightParams_default_instance_;
                      }
                      puVar6 = (undefined1 *)((LSTMWeightParams *)puVar6)->blockinputbiasvector_;
                      if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
                        puVar6 = Specification::_WeightParams_default_instance_;
                      }
                      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_110,"Unidirectional LSTM","");
                      pvVar3 = (local_c8->name_).tagged_ptr_.ptr_;
                      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_f0,"block input bias vector","");
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar6,local_d0,1,&local_110
                                 ,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_f0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                        operator_delete(local_f0._M_dataplus._M_p,
                                        local_f0.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_110._M_dataplus._M_p != &local_110.field_2) {
                        operator_delete(local_110._M_dataplus._M_p,
                                        local_110.field_2._M_allocated_capacity + 1);
                      }
                      bVar5 = Result::good(__return_storage_ptr__);
                      if (!bVar5) goto LAB_00342905;
                      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)pcVar2 != paVar1) {
                        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                      }
                      puVar6 = (undefined1 *)local_90;
                      if (local_90 == (LSTMWeightParams *)0x0) {
                        puVar6 = Specification::_LSTMWeightParams_default_instance_;
                      }
                      puVar6 = (undefined1 *)((LSTMWeightParams *)puVar6)->outputgatebiasvector_;
                      if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
                        puVar6 = Specification::_WeightParams_default_instance_;
                      }
                      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_110,"Unidirectional LSTM","");
                      pvVar3 = (local_c8->name_).tagged_ptr_.ptr_;
                      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_f0,"output gate bias vector","");
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar6,local_d0,1,&local_110
                                 ,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_f0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                        operator_delete(local_f0._M_dataplus._M_p,
                                        local_f0.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_110._M_dataplus._M_p != &local_110.field_2) {
                        operator_delete(local_110._M_dataplus._M_p,
                                        local_110.field_2._M_allocated_capacity + 1);
                      }
                      bVar5 = Result::good(__return_storage_ptr__);
                      if (!bVar5) goto LAB_00342905;
                      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)pcVar2 != paVar1) {
                        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                      }
                    }
                    if (local_98 == (LSTMParams *)0x0) {
                      local_98 = (LSTMParams *)Specification::_LSTMParams_default_instance_;
                    }
                    if (local_98->haspeepholevectors_ == true) {
                      puVar6 = (undefined1 *)local_90;
                      if (local_90 == (LSTMWeightParams *)0x0) {
                        puVar6 = Specification::_LSTMWeightParams_default_instance_;
                      }
                      puVar6 = (undefined1 *)((LSTMWeightParams *)puVar6)->inputgatepeepholevector_;
                      if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
                        puVar6 = Specification::_WeightParams_default_instance_;
                      }
                      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_110,"Unidirectional LSTM","");
                      pvVar3 = (local_c8->name_).tagged_ptr_.ptr_;
                      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_f0,"input gate peep hole vector","");
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar6,local_d0,1,&local_110
                                 ,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_f0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                        operator_delete(local_f0._M_dataplus._M_p,
                                        local_f0.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_110._M_dataplus._M_p != &local_110.field_2) {
                        operator_delete(local_110._M_dataplus._M_p,
                                        local_110.field_2._M_allocated_capacity + 1);
                      }
                      bVar5 = Result::good(__return_storage_ptr__);
                      if (!bVar5) goto LAB_00342905;
                      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)pcVar2 != paVar1) {
                        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                      }
                      puVar6 = (undefined1 *)local_90;
                      if (local_90 == (LSTMWeightParams *)0x0) {
                        puVar6 = Specification::_LSTMWeightParams_default_instance_;
                      }
                      puVar6 = (undefined1 *)((LSTMWeightParams *)puVar6)->forgetgatepeepholevector_
                      ;
                      if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
                        puVar6 = Specification::_WeightParams_default_instance_;
                      }
                      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_110,"Unidirectional LSTM","");
                      pvVar3 = (local_c8->name_).tagged_ptr_.ptr_;
                      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_f0,"forget gate peep hole vector","");
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar6,local_d0,1,&local_110
                                 ,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_f0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                        operator_delete(local_f0._M_dataplus._M_p,
                                        local_f0.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_110._M_dataplus._M_p != &local_110.field_2) {
                        operator_delete(local_110._M_dataplus._M_p,
                                        local_110.field_2._M_allocated_capacity + 1);
                      }
                      bVar5 = Result::good(__return_storage_ptr__);
                      if (!bVar5) goto LAB_00342905;
                      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)pcVar2 != paVar1) {
                        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                      }
                      if (local_90 == (LSTMWeightParams *)0x0) {
                        local_90 = (LSTMWeightParams *)
                                   Specification::_LSTMWeightParams_default_instance_;
                      }
                      puVar6 = (undefined1 *)local_90->outputgatepeepholevector_;
                      if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
                        puVar6 = Specification::_WeightParams_default_instance_;
                      }
                      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_110,"Unidirectional LSTM","");
                      pvVar3 = (local_c8->name_).tagged_ptr_.ptr_;
                      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_f0,"output gate peep hole vector","");
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar6,local_d0,1,&local_110
                                 ,(string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_f0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                        operator_delete(local_f0._M_dataplus._M_p,
                                        local_f0.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_110._M_dataplus._M_p != &local_110.field_2) {
                        operator_delete(local_110._M_dataplus._M_p,
                                        local_110.field_2._M_allocated_capacity + 1);
                      }
                      bVar5 = Result::good(__return_storage_ptr__);
                      if (!bVar5) goto LAB_00342905;
                      pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)pcVar2 != paVar1) {
                        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
                      }
                    }
                    Result::Result(__return_storage_ptr__);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    std::operator+(&local_f0,"Unidirectional LSTM layer:",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_f0);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110.field_2._8_8_ = plVar7[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_110._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00342905:
  Specification::UniDirectionalLSTMLayerParams::~UniDirectionalLSTMLayerParams
            ((UniDirectionalLSTMLayerParams *)local_c0);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateUniDirectionalLSTMLayer(const Specification::NeuralNetworkLayer& layer) {
    // Must specify hidden states
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 3));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 3, 3));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "UniDirectionalLSTM", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "UniDirectionalLSTM", 5, 5, blobNameToRank));
    }

    for (const auto& activation : layer.unidirectionallstm().activations()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRecurrentActivationParams(activation));
    }

    // Validate common LSTM params and ensure that all weight field types are consistent
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateLSTMWeightParams(layer.unidirectionallstm().weightparams(), layer.unidirectionallstm().params()));

    Specification::UniDirectionalLSTMLayerParams recurrent = layer.unidirectionallstm();
    uint64_t x = recurrent.inputvectorsize();
    uint64_t h = recurrent.outputvectorsize();

    if (recurrent.activations_size() != 3){
        const std::string err = std::string("Unidirectional LSTM layer:" + layer.name() + " must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Check weight matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().inputgateweightmatrix(), h*x, h,
                                                                  "Unidirectional LSTM", layer.name(), "input gate weight matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().forgetgateweightmatrix(), h*x, h,
                                                                  "Unidirectional LSTM", layer.name(), "forget gate weight matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().blockinputweightmatrix(), h*x, h,
                                                                  "Unidirectional LSTM", layer.name(), "block input gate weight matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().outputgateweightmatrix(), h*x, h,
                                                                  "Unidirectional LSTM", layer.name(), "output gate weight matrix"));

    // Check recursion matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().inputgaterecursionmatrix(), h*h, h,
                                                                  "Unidirectional LSTM", layer.name(), "input gate recursion matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().forgetgaterecursionmatrix(), h*h, h,
                                                                  "Unidirectional LSTM", layer.name(), "forget gate recursion matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().blockinputrecursionmatrix(), h*h, h,
                                                                  "Unidirectional LSTM", layer.name(), "block input gate recursion matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().outputgaterecursionmatrix(), h*h, h,
                                                                  "Unidirectional LSTM", layer.name(), "output gate recursion matrix"));

    // Check bias vectors
    if (recurrent.params().hasbiasvectors()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().inputgatebiasvector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "input gate bias vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().forgetgatebiasvector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "forget gate bias vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().blockinputbiasvector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "block input bias vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().outputgatebiasvector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "output gate bias vector"));
    }
    // Check peephole vectors
    if (recurrent.params().haspeepholevectors()){
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().inputgatepeepholevector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "input gate peep hole vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().forgetgatepeepholevector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "forget gate peep hole vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().outputgatepeepholevector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "output gate peep hole vector"));
    }

    return Result();
}